

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSim.c
# Opt level: O1

void Dch_PerformRandomSimulation(Aig_Man_t *pAig,Vec_Ptr_t *vSims)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void **ppvVar5;
  void *pvVar6;
  void *pvVar7;
  int *piVar8;
  ulong uVar9;
  void **ppvVar10;
  void *pvVar11;
  uint uVar12;
  Vec_Ptr_t *pVVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  
  if ((1 < vSims->nSize) && (uVar15 = pAig->pConst1->Id, uVar15 < (uint)vSims->nSize)) {
    ppvVar5 = vSims->pArray;
    pvVar6 = ppvVar5[1];
    pvVar7 = *ppvVar5;
    memset(ppvVar5[uVar15],0xff,
           ((long)pvVar6 - (long)pvVar7) * 0x40000000 >> 0x1e & 0xfffffffffffffffc);
    pVVar13 = pAig->vCis;
    uVar15 = (uint)((ulong)((long)pvVar6 - (long)pvVar7) >> 2);
    if (0 < pVVar13->nSize) {
      lVar16 = 0;
      do {
        iVar1 = *(int *)((long)pVVar13->pArray[lVar16] + 0x24);
        if (((long)iVar1 < 0) || (vSims->nSize <= iVar1)) goto LAB_006813aa;
        piVar8 = (int *)vSims->pArray[iVar1];
        if (0 < (int)uVar15) {
          uVar17 = 0;
          do {
            uVar12 = Aig_ManRandom(0);
            piVar8[uVar17] = uVar12;
            uVar17 = uVar17 + 1;
          } while ((uVar15 & 0x7fffffff) != uVar17);
        }
        *piVar8 = *piVar8 << 1;
        lVar16 = lVar16 + 1;
        pVVar13 = pAig->vCis;
      } while (lVar16 < pVVar13->nSize);
    }
    pVVar13 = pAig->vObjs;
    if (0 < pVVar13->nSize) {
      ppvVar5 = pVVar13->pArray;
      uVar17 = (ulong)(uVar15 & 0x7fffffff);
      lVar16 = 0;
      do {
        pvVar6 = ppvVar5[lVar16];
        if ((pvVar6 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar6 + 0x18) & 7) - 7)) {
          uVar14 = *(ulong *)((long)pvVar6 + 8);
          iVar1 = *(int *)((uVar14 & 0xfffffffffffffffe) + 0x24);
          if (((long)iVar1 < 0) || (iVar2 = vSims->nSize, iVar2 <= iVar1)) goto LAB_006813aa;
          uVar9 = *(ulong *)((long)pvVar6 + 0x10);
          iVar3 = *(int *)((uVar9 & 0xfffffffffffffffe) + 0x24);
          if (((long)iVar3 < 0) || (iVar2 <= iVar3)) goto LAB_006813aa;
          iVar4 = *(int *)((long)pvVar6 + 0x24);
          if (((long)iVar4 < 0) || (iVar2 <= iVar4)) goto LAB_006813aa;
          ppvVar10 = vSims->pArray;
          pvVar6 = ppvVar10[iVar1];
          pvVar7 = ppvVar10[iVar3];
          pvVar11 = ppvVar10[iVar4];
          if (((uint)uVar14 & (uint)uVar9 & 1) == 0) {
            if ((uVar9 & 1) == 0 && (uVar14 & 1) != 0) {
              if (0 < (int)uVar15) {
                uVar14 = 0;
                do {
                  *(uint *)((long)pvVar11 + uVar14 * 4) =
                       ~*(uint *)((long)pvVar6 + uVar14 * 4) & *(uint *)((long)pvVar7 + uVar14 * 4);
                  uVar14 = uVar14 + 1;
                } while (uVar17 != uVar14);
              }
            }
            else if ((uVar9 & 1) == 0 || (uVar14 & 1) != 0) {
              if (0 < (int)uVar15) {
                uVar14 = 0;
                do {
                  *(uint *)((long)pvVar11 + uVar14 * 4) =
                       *(uint *)((long)pvVar7 + uVar14 * 4) & *(uint *)((long)pvVar6 + uVar14 * 4);
                  uVar14 = uVar14 + 1;
                } while (uVar17 != uVar14);
              }
            }
            else if (0 < (int)uVar15) {
              uVar14 = 0;
              do {
                *(uint *)((long)pvVar11 + uVar14 * 4) =
                     ~*(uint *)((long)pvVar7 + uVar14 * 4) & *(uint *)((long)pvVar6 + uVar14 * 4);
                uVar14 = uVar14 + 1;
              } while (uVar17 != uVar14);
            }
          }
          else if (0 < (int)uVar15) {
            uVar14 = 0;
            do {
              *(uint *)((long)pvVar11 + uVar14 * 4) =
                   ~(*(uint *)((long)pvVar7 + uVar14 * 4) | *(uint *)((long)pvVar6 + uVar14 * 4));
              uVar14 = uVar14 + 1;
            } while (uVar17 != uVar14);
          }
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < pVVar13->nSize);
    }
    return;
  }
LAB_006813aa:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Dch_PerformRandomSimulation( Aig_Man_t * pAig, Vec_Ptr_t * vSims )
{
    unsigned * pSim, * pSim0, * pSim1;
    Aig_Obj_t * pObj;
    int i, k, nWords;
    nWords = (unsigned *)Vec_PtrEntry(vSims, 1) - (unsigned *)Vec_PtrEntry(vSims, 0);

    // assign const 1 sim info
    pObj = Aig_ManConst1(pAig);
    pSim = Dch_ObjSim( vSims, pObj );
    memset( pSim, 0xff, sizeof(unsigned) * nWords );

    // assign primary input random sim info
    Aig_ManForEachCi( pAig, pObj, i )
    {
        pSim = Dch_ObjSim( vSims, pObj );
        for ( k = 0; k < nWords; k++ )
            pSim[k] = Dch_ObjRandomSim();
        pSim[0] <<= 1;
    }

    // simulate AIG in the topological order
    Aig_ManForEachNode( pAig, pObj, i )
    {
        pSim0 = Dch_ObjSim( vSims, Aig_ObjFanin0(pObj) ); 
        pSim1 = Dch_ObjSim( vSims, Aig_ObjFanin1(pObj) ); 
        pSim  = Dch_ObjSim( vSims, pObj );

        if ( Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj) ) // both are compls
        {
            for ( k = 0; k < nWords; k++ )
                pSim[k] = ~pSim0[k] & ~pSim1[k];
        }
        else if ( Aig_ObjFaninC0(pObj) && !Aig_ObjFaninC1(pObj) ) // first one is compl
        {
            for ( k = 0; k < nWords; k++ )
                pSim[k] = ~pSim0[k] & pSim1[k];
        }
        else if ( !Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj) ) // second one is compl
        {
            for ( k = 0; k < nWords; k++ )
                pSim[k] = pSim0[k] & ~pSim1[k];
        }
        else // if ( Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj) ) // none is compl
        {
            for ( k = 0; k < nWords; k++ )
                pSim[k] = pSim0[k] & pSim1[k];
        }
    }
    // get simulation information for primary outputs
}